

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O0

void __thiscall MeCab::Mmap<char>::Mmap(Mmap<char> *this)

{
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Mmap_001c6808;
  *(undefined8 *)&in_RDI->field_0x8 = 0;
  std::__cxx11::string::string((string *)&in_RDI->field_0x18);
  whatlog::whatlog(in_RDI);
  *(undefined4 *)&in_RDI[1].field_0x38 = 0xffffffff;
  return;
}

Assistant:

Mmap(): text(0), fd(-1) {}